

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

TestCase * TestCharReaderFailIfExtraTestcommentAfterBool::factory(void)

{
  TestCase *pTVar1;
  TestCharReaderFailIfExtraTestcommentAfterBool *in_stack_fffffffffffffff0;
  
  pTVar1 = (TestCase *)operator_new(0x10);
  pTVar1->_vptr_TestCase = (_func_int **)0x0;
  pTVar1->result_ = (TestResult *)0x0;
  TestCharReaderFailIfExtraTestcommentAfterBool(in_stack_fffffffffffffff0);
  return pTVar1;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, commentAfterBool) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      " true /*trailing\ncomment*/";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT_STRING_EQUAL("", errs);
  JSONTEST_ASSERT_EQUAL(true, root.asBool());
  delete reader;
}